

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

bool AppInitServers(NodeContext *node)

{
  long lVar1;
  bool bVar2;
  ArgsManager **ppAVar3;
  long in_FS_OFFSET;
  ArgsManager *args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  function<void_()> *in_stack_ffffffffffffff48;
  undefined1 fDefault;
  char *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff6c;
  uint uVar4;
  char *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff7c;
  any *in_stack_ffffffffffffff80;
  ArgsManager *this;
  bool local_61;
  any *in_stack_ffffffffffffffa0;
  any local_58;
  allocator<char> local_41 [33];
  SignalInterrupt *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ppAVar3 = inline_assertion_check<true,ArgsManager*&>
                      ((ArgsManager **)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                       ,in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,
                       in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  this = *ppAVar3;
  inline_assertion_check<true,util::SignalInterrupt*&>
            ((SignalInterrupt **)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
             in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58);
  bVar2 = InitHTTPServer(in_stack_ffffffffffffffe0);
  if (bVar2) {
    StartRPC();
    std::function<void()>::operator=
              (in_stack_ffffffffffffff48,
               (_func_void *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    std::any::
    any<node::NodeContext*,node::NodeContext*,std::any::_Manager_internal<node::NodeContext*>,void>
              ((any *)in_stack_ffffffffffffff48,
               (NodeContext **)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    fDefault = (undefined1)((ulong)in_stack_ffffffffffffff48 >> 0x38);
    bVar2 = StartHTTPRPC(in_stack_ffffffffffffffa0);
    uVar5 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff78);
    uVar4 = (uint)bVar2 << 0x18 ^ 0xff000000;
    std::any::~any((any *)in_stack_ffffffffffffff38);
    if ((uVar4 & 0x1000000) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)in_stack_ffffffffffffff80,
                 (allocator<char> *)CONCAT44(in_stack_ffffffffffffff7c,uVar5));
      bVar2 = ArgsManager::GetBoolArg
                        ((ArgsManager *)
                         CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff38,(bool)fDefault);
      std::__cxx11::string::~string(in_stack_ffffffffffffff38);
      std::allocator<char>::~allocator(local_41);
      if (bVar2) {
        std::any::
        any<node::NodeContext*,node::NodeContext*,std::any::_Manager_internal<node::NodeContext*>,void>
                  (&local_58,
                   (NodeContext **)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
        StartREST(in_stack_ffffffffffffff80);
        std::any::~any((any *)in_stack_ffffffffffffff38);
      }
      StartHTTPServer();
      local_61 = true;
    }
    else {
      local_61 = false;
    }
  }
  else {
    local_61 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_61;
}

Assistant:

static bool AppInitServers(NodeContext& node)
{
    const ArgsManager& args = *Assert(node.args);
    if (!InitHTTPServer(*Assert(node.shutdown))) {
        return false;
    }
    StartRPC();
    node.rpc_interruption_point = RpcInterruptionPoint;
    if (!StartHTTPRPC(&node))
        return false;
    if (args.GetBoolArg("-rest", DEFAULT_REST_ENABLE)) StartREST(&node);
    StartHTTPServer();
    return true;
}